

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

int bcache_write(filemgr *file,bid_t bid,void *buf,bcache_dirty_t dirty,bool final_write,
                bool ignore_if_exist)

{
  uint uVar1;
  byte bVar2;
  avl_node *node;
  int in_ECX;
  hash_elem *in_RDX;
  avl_tree *tree;
  hash *in_RSI;
  uint in_R8D;
  byte in_R9B;
  uint8_t marker;
  dirty_item *ditem;
  size_t shard_num;
  timeval tp;
  fnamedic_item *fname_new;
  bcache_item query;
  bcache_item *item;
  hash_elem *h;
  undefined4 in_stack_ffffffffffffff38;
  memory_order in_stack_ffffffffffffff3c;
  int iVar3;
  hash_elem *e;
  hash *ht;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  char cVar4;
  char *in_stack_ffffffffffffff60;
  fnamedic_item *in_stack_ffffffffffffff78;
  __pointer_type local_80;
  bcache_item *local_38;
  hash_elem *local_30;
  
  uVar1 = in_R8D & 1;
  iVar3 = in_ECX;
  e = in_RDX;
  ht = in_RSI;
  local_80 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x10ecac);
  if (local_80 == (__pointer_type)0x0) {
    pthread_spin_lock(&bcache_lock);
    local_80 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x10ecd9);
    if (local_80 == (__pointer_type)0x0) {
      local_80 = _fname_create((filemgr *)CONCAT44(iVar3,in_R8D));
    }
    pthread_spin_unlock(&bcache_lock);
  }
  gettimeofday((timeval *)&stack0xffffffffffffff70,(__timezone_ptr_t)0x0);
  atomic_store_uint64_t
            ((atomic<unsigned_long> *)CONCAT44(iVar3,in_R8D),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),memory_order_relaxed);
  tree = (avl_tree *)((ulong)in_RSI % local_80->num_shards);
  pthread_spin_lock(&local_80->shards[(long)tree].lock);
  local_30 = hash_find(ht,e);
  if (local_30 == (hash_elem *)0x0) {
    while (local_38 = _bcache_alloc_freeblock(), local_38 == (bcache_item *)0x0) {
      pthread_spin_unlock(&local_80->shards[(long)tree].lock);
      _bcache_evict(in_stack_ffffffffffffff78);
      pthread_spin_lock(&local_80->shards[(long)tree].lock);
    }
    local_30 = hash_find(ht,e);
    if (local_30 == (hash_elem *)0x0) {
      local_38->bid = (bid_t)in_RSI;
      std::__atomic_base<unsigned_char>::operator=
                ((__atomic_base<unsigned_char> *)e,(__int_type_conflict1)((uint)iVar3 >> 0x18));
      hash_insert(ht,e);
      local_30 = &local_38->hash_elem;
    }
    else {
      _bcache_release_freeblock((bcache_item *)0x10eea0);
      local_38 = (bcache_item *)((long)(local_30 + -1) + 8);
    }
  }
  else {
    if ((in_R9B & 1) != 0) {
      pthread_spin_unlock(&local_80->shards[(long)tree].lock);
      return 0;
    }
    local_38 = (bcache_item *)&local_30[-1].avl.left;
  }
  if (local_30 == (hash_elem *)0x0) {
    fdb_assert_die(in_stack_ffffffffffffff60,
                   (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                   (int)((ulong)ht >> 0x20),(uint64_t)e,CONCAT44(iVar3,in_R8D));
  }
  bVar2 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
  if ((bVar2 & 4) != 0) {
    atomic_incr_uint64_t((atomic<unsigned_long> *)CONCAT44(iVar3,in_R8D),in_stack_ffffffffffffff3c);
  }
  bVar2 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
  if (((bVar2 & 1) == 0) &&
     (bVar2 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e),
     (bVar2 & 4) == 0)) {
    list_remove(&local_80->shards[(long)tree].cleanlist,&local_38->list_elem);
  }
  std::__atomic_base<unsigned_char>::operator&=
            (&(local_38->flag).super___atomic_base<unsigned_char>,0xfb);
  if (in_ECX == 1) {
    bVar2 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
    if ((bVar2 & 1) == 0) {
      node = (avl_node *)malloc(0x20);
      node->parent = (avl_node *)local_38;
      cVar4 = *(char *)((long)in_RDX + (long)bcache_blocksize + -1);
      if (cVar4 == -1) {
        avl_insert(tree,node,(avl_cmp_func *)CONCAT17(0xff,in_stack_ffffffffffffff58));
      }
      else {
        if (uVar1 != 0) {
          std::__atomic_base<unsigned_char>::operator|=
                    (&(local_38->flag).super___atomic_base<unsigned_char>,'\x02');
          atomic_incr_uint64_t
                    ((atomic<unsigned_long> *)CONCAT44(iVar3,in_R8D),in_stack_ffffffffffffff3c);
        }
        avl_insert(tree,node,(avl_cmp_func *)CONCAT17(cVar4,in_stack_ffffffffffffff58));
      }
    }
    std::__atomic_base<unsigned_char>::operator|=
              (&(local_38->flag).super___atomic_base<unsigned_char>,'\x01');
  }
  else {
    bVar2 = std::__atomic_base::operator_cast_to_unsigned_char((__atomic_base<unsigned_char> *)e);
    if ((bVar2 & 1) == 0) {
      list_push_front(&local_80->shards[(long)tree].cleanlist,&local_38->list_elem);
      std::__atomic_base<unsigned_char>::operator&=
                (&(local_38->flag).super___atomic_base<unsigned_char>,0xfe);
    }
  }
  memcpy(local_38->addr,in_RDX,(long)bcache_blocksize);
  _bcache_set_score(local_38);
  pthread_spin_unlock(&local_80->shards[(long)tree].lock);
  return bcache_blocksize;
}

Assistant:

int bcache_write(struct filemgr *file,
                 bid_t bid,
                 void *buf,
                 bcache_dirty_t dirty,
                 bool final_write,
                 bool ignore_if_exist)
{
    struct hash_elem *h = NULL;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss
        // get a free block
        while ((item = _bcache_alloc_freeblock()) == NULL) {
            // no free block .. perform eviction
            spin_unlock(&fname_new->shards[shard_num].lock);

            _bcache_evict(fname_new);

            spin_lock(&fname_new->shards[shard_num].lock);
        }

        // re-search hash table
        h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
        if (h == NULL) {
            // insert into hash table
            item->bid = bid;
            item->flag = BCACHE_FREE;
            hash_insert(&fname_new->shards[shard_num].hashtable, &item->hash_elem);
            h = &item->hash_elem;
        } else {
            // insert into freelist again
            _bcache_release_freeblock(item);
            item = _get_entry(h, struct bcache_item, hash_elem);
        }
    } else {
        // cache hit.
        if (ignore_if_exist) {
            spin_unlock(&fname_new->shards[shard_num].lock);
            return 0;
        }
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    fdb_assert(h, h, NULL);

    if (item->flag & BCACHE_FREE) {
        atomic_incr_uint64_t(&fname_new->nitems);
    }

    // remove from the list if the block is in clean list
    if (!(item->flag & BCACHE_DIRTY) && !(item->flag & BCACHE_FREE)) {
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
    }
    item->flag &= ~BCACHE_FREE;

    if (dirty == BCACHE_REQ_DIRTY) {
        // DIRTY request
        // to avoid re-insert already existing item into tree
        if (!(item->flag & BCACHE_DIRTY)) {
            // dirty block
            // insert into tree
            struct dirty_item *ditem;
            uint8_t marker;

            ditem = (struct dirty_item *)
                    mempool_alloc(sizeof(struct dirty_item));
            ditem->item = item;

            marker = *((uint8_t*)buf + bcache_blocksize-1);
            if (marker == BLK_MARKER_BNODE) {
                // b-tree node
                avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
            } else {
                if (final_write) {
                    item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                    atomic_incr_uint64_t(&fname_new->nimmutable);
                }
                avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                           _dirty_cmp);
            }
        }
        item->flag |= BCACHE_DIRTY;
    } else {
        // CLEAN request
        // insert into clean list only when it was originally clean
        if (!(item->flag & BCACHE_DIRTY)) {
            list_push_front(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
            item->flag &= ~(BCACHE_DIRTY);
        }
    }

    memcpy(item->addr, buf, bcache_blocksize);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return bcache_blocksize;
}